

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::AddExtensionGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  int iVar1;
  undefined8 this_00;
  bool bVar2;
  int iVar3;
  reference this_01;
  pointer local_48 [3];
  undefined1 local_30 [16];
  FieldDescriptor *extension;
  undefined8 uStack_18;
  int i;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
  *extension_generators_local;
  MessageGenerator *this_local;
  
  extension._4_4_ = 0;
  uStack_18 = extension_generators;
  extension_generators_local =
       (vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
        *)this;
  do {
    iVar1 = extension._4_4_;
    iVar3 = Descriptor::extension_count(this->descriptor_);
    if (iVar3 <= iVar1) {
      return;
    }
    local_30._8_8_ = Descriptor::extension(this->descriptor_,extension._4_4_);
    if ((this->generation_options_->strip_custom_options & 1U) == 0) {
LAB_0048c205:
      this_00 = uStack_18;
      std::
      make_unique<google::protobuf::compiler::objectivec::ExtensionGenerator,std::__cxx11::string_const&,google::protobuf::FieldDescriptor_const*&,google::protobuf::compiler::objectivec::GenerationOptions_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (FieldDescriptor **)&this->class_name_,(GenerationOptions *)(local_30 + 8));
      std::
      vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
      ::push_back((vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                   *)this_00,(value_type *)local_30);
      std::
      unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                     *)local_30);
      this_01 = std::
                vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                ::back((vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                        *)uStack_18);
      local_48[0] = std::
                    unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                    ::get(this_01);
      std::
      vector<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
      ::push_back(&this->extension_generators_,local_48);
    }
    else {
      bVar2 = ExtensionIsCustomOption((FieldDescriptor *)local_30._8_8_);
      if (!bVar2) goto LAB_0048c205;
    }
    extension._4_4_ = extension._4_4_ + 1;
  } while( true );
}

Assistant:

void MessageGenerator::AddExtensionGenerators(
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    const FieldDescriptor* extension = descriptor_->extension(i);
    if (!generation_options_.strip_custom_options ||
        !ExtensionIsCustomOption(extension)) {
      extension_generators->push_back(std::make_unique<ExtensionGenerator>(
          class_name_, extension, generation_options_));
      extension_generators_.push_back(extension_generators->back().get());
    }
  }
}